

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O0

void __thiscall
picosha2::hash256_one_by_one::process<unsigned_char_const*>
          (hash256_one_by_one *this,uchar *first,uchar *last)

{
  uchar *__last;
  uchar *__first;
  word_t n;
  ulong uVar1;
  size_type sVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  const_iterator local_78;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  const_iterator local_68;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  uchar *local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  long local_38;
  size_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  uchar *local_20;
  uchar *last_local;
  uchar *first_local;
  hash256_one_by_one *this_local;
  
  local_20 = last;
  last_local = first;
  first_local = (uchar *)this;
  n = std::distance<unsigned_char_const*>(first,last);
  add_to_data_length(this,n);
  __first = last_local;
  __last = local_20;
  local_28 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (&this->buffer_);
  i = (size_t)std::
              copy<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (__first,__last,
                         (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_28);
  local_38 = 0;
  while( true ) {
    uVar1 = local_38 + 0x40;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
    if (sVar2 < uVar1) break;
    local_48._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->buffer_);
    local_40 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_48,local_38);
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->buffer_);
    local_58 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_60,local_38);
    local_50 = (uchar *)__gnu_cxx::
                        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator+(&local_58,0x40);
    detail::
    hash256_block<unsigned_long*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (this->h_,local_40,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_50);
    local_38 = local_38 + 0x40;
  }
  local_70._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->buffer_);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_68,&local_70);
  local_88._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->buffer_);
  local_80 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_88,local_38);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_78,&local_80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
            (&this->buffer_,local_68,local_78);
  return;
}

Assistant:

void process(RaIter first, RaIter last) {
        add_to_data_length(static_cast<word_t>(std::distance(first, last)));
        std::copy(first, last, std::back_inserter(buffer_));
        std::size_t i = 0;
        for (; i + 64 <= buffer_.size(); i += 64) {
            detail::hash256_block(h_, buffer_.begin() + i,
                                  buffer_.begin() + i + 64);
        }
        buffer_.erase(buffer_.begin(), buffer_.begin() + i);
    }